

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psconv.c
# Opt level: O2

FT_Long PS_Conv_Strtol(FT_Byte **cursor,FT_Byte *limit,FT_Long base)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  pbVar6 = *cursor;
  if (base - 0x25U < 0xffffffffffffffdd || limit <= pbVar6) {
    return 0;
  }
  bVar1 = *pbVar6;
  if ((bVar1 == 0x2d) || (bVar1 == 0x2b)) {
    pbVar6 = pbVar6 + 1;
    if (pbVar6 == limit) {
      return 0;
    }
    bVar10 = bVar1 == 0x2d;
    if (*pbVar6 == 0x2b) {
      return 0;
    }
    if (*pbVar6 == 0x2d) {
      return 0;
    }
  }
  else {
    bVar10 = false;
  }
  uVar5 = 0x7fffffff / (base & 0xffffffffU);
  bVar2 = false;
  uVar4 = 0;
  for (; pbVar6 < limit; pbVar6 = pbVar6 + 1) {
    uVar8 = (ulong)*pbVar6;
    if (((uVar8 < 0x21) && ((0x100003601U >> (uVar8 & 0x3f) & 1) != 0)) || ((char)*pbVar6 < '\0'))
    break;
    lVar9 = (long)ft_char_table[uVar8];
    if ((lVar9 < 0) || (base <= lVar9)) break;
    uVar7 = uVar4;
    bVar3 = true;
    if (((long)uVar4 <= (long)uVar5) &&
       ((uVar4 != uVar5 ||
        (uVar7 = uVar5, bVar3 = true,
        (uint)(int)ft_char_table[uVar8] <= (uint)(0x7fffffff % (base & 0xffffffffU)))))) {
      uVar7 = uVar4 * base + lVar9;
      bVar3 = bVar2;
    }
    bVar2 = bVar3;
    uVar4 = uVar7;
  }
  *cursor = pbVar6;
  uVar5 = 0x7fffffff;
  if (!bVar2) {
    uVar5 = uVar4;
  }
  uVar4 = -uVar5;
  if (!bVar10) {
    uVar4 = uVar5;
  }
  return uVar4;
}

Assistant:

FT_LOCAL_DEF( FT_Long )
  PS_Conv_Strtol( FT_Byte**  cursor,
                  FT_Byte*   limit,
                  FT_Long    base )
  {
    FT_Byte*  p = *cursor;

    FT_Long   num           = 0;
    FT_Bool   sign          = 0;
    FT_Bool   have_overflow = 0;

    FT_Long   num_limit;
    FT_Char   c_limit;


    if ( p >= limit )
      goto Bad;

    if ( base < 2 || base > 36 )
    {
      FT_TRACE4(( "!!!INVALID BASE:!!!" ));
      return 0;
    }

    if ( *p == '-' || *p == '+' )
    {
      sign = FT_BOOL( *p == '-' );

      p++;
      if ( p == limit )
        goto Bad;

      /* only a single sign is allowed */
      if ( *p == '-' || *p == '+' )
        return 0;
    }

    num_limit = 0x7FFFFFFFL / base;
    c_limit   = (FT_Char)( 0x7FFFFFFFL % base );

    for ( ; p < limit; p++ )
    {
      FT_Char  c;


      if ( IS_PS_SPACE( *p ) || *p OP 0x80 )
        break;

      c = ft_char_table[*p & 0x7F];

      if ( c < 0 || c >= base )
        break;

      if ( num > num_limit || ( num == num_limit && c > c_limit ) )
        have_overflow = 1;
      else
        num = num * base + c;
    }

    *cursor = p;

    if ( have_overflow )
    {
      num = 0x7FFFFFFFL;
      FT_TRACE4(( "!!!OVERFLOW:!!!" ));
    }

    if ( sign )
      num = -num;

    return num;

  Bad:
    FT_TRACE4(( "!!!END OF DATA:!!!" ));
    return 0;
  }